

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O3

void __thiscall asl::Var::free(Var *this,void *__ptr)

{
  int *piVar1;
  Type TVar2;
  
  TVar2 = this->_type;
  if (TVar2 == DIC) {
    Array<asl::Map<asl::String,_asl::Var>::KeyVal>::~Array
              ((Array<asl::Map<asl::String,_asl::Var>::KeyVal> *)&(this->field_1)._a);
  }
  else if (TVar2 == ARRAY) {
    LOCK();
    piVar1 = (int *)((this->field_1)._l + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      Array<asl::Var>::free((Array<asl::Var> *)&(this->field_1)._a,__ptr);
    }
  }
  else if (TVar2 == STRING) {
    LOCK();
    piVar1 = (int *)((this->field_1)._l + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      ::free((void *)((this->field_1)._l + -0x10));
      (this->field_1)._d = 0.0;
    }
  }
  this->_type = NONE;
  return;
}

Assistant:

void Var::free()
{
	switch(_type) {
	case STRING: DEL_STRING(_s); break;
	case ARRAY: DEL_ARRAY(_a); break;
	case OBJ: DEL_DIC(_o); break;
	default: break;
	}
	_type=NONE;
}